

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ecdsa_verify
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *msghash32,
              secp256k1_pubkey *pubkey)

{
  int iVar1;
  secp256k1_pubkey *sig_00;
  void *pvVar2;
  char *pcVar3;
  secp256k1_scalar m;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_scalar computed_r;
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar sn;
  uchar c [32];
  secp256k1_ge q;
  secp256k1_gej pr;
  secp256k1_ge local_130;
  secp256k1_gej pubkeyj;
  
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/secp256k1.c"
            ,0x1d5,"test condition failed: ctx != NULL");
    abort();
  }
  if (msghash32 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "msghash32 != NULL";
  }
  else if (sig == (secp256k1_ecdsa_signature *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "sig != NULL";
  }
  else {
    if (pubkey != (secp256k1_pubkey *)0x0) {
      sig_00 = pubkey;
      secp256k1_scalar_set_b32(&m,msghash32,(int *)0x0);
      secp256k1_ecdsa_signature_load
                ((secp256k1_context *)&r,&s,(secp256k1_scalar *)sig,
                 (secp256k1_ecdsa_signature *)sig_00);
      if (6 < s) {
        return 0;
      }
      iVar1 = secp256k1_pubkey_load(ctx,&q,pubkey);
      if (iVar1 == 0) {
        return 0;
      }
      if (s == 0 || r == 0) {
        return 0;
      }
      secp256k1_scalar_inverse(&sn,&s);
      u1 = (m * sn) % 0xd;
      u2 = (sn * r) % 0xd;
      secp256k1_gej_set_ge(&pubkeyj,&q);
      secp256k1_ecmult(&pr,&pubkeyj,&u2,&u1);
      iVar1 = secp256k1_gej_is_infinity(&pr);
      if (iVar1 != 0) {
        return 0;
      }
      secp256k1_ge_set_gej(&local_130,&pr);
      secp256k1_fe_normalize(&local_130.x);
      secp256k1_fe_get_b32(c,&local_130.x);
      secp256k1_scalar_set_b32(&computed_r,c,(int *)0x0);
      return (uint)(r == computed_r);
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "pubkey != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_ecdsa_verify(const secp256k1_context* ctx, const secp256k1_ecdsa_signature *sig, const unsigned char *msghash32, const secp256k1_pubkey *pubkey) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_scalar_set_b32(&m, msghash32, NULL);
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return (!secp256k1_scalar_is_high(&s) &&
            secp256k1_pubkey_load(ctx, &q, pubkey) &&
            secp256k1_ecdsa_sig_verify(&r, &s, &q, &m));
}